

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjust-times.cpp
# Opt level: O0

void time_format(char *buf,size_t size,timespec ts)

{
  int iVar1;
  tm *__tp;
  size_t sVar2;
  char local_58 [4];
  int ret;
  char time_format [24];
  tm *tm;
  time_t clock;
  size_t size_local;
  char *buf_local;
  timespec ts_local;
  
  ts_local.tv_sec = ts.tv_nsec;
  tm = (tm *)ts.tv_sec;
  clock = size;
  size_local = (size_t)buf;
  buf_local = (char *)tm;
  __tp = localtime((time_t *)&tm);
  if (__tp == (tm *)0x0) {
    snprintf((char *)size_local,clock,"<can\'t find local time>");
  }
  else {
    iVar1 = snprintf(local_58,0x18,"%%F %%T.%09ld",ts_local.tv_sec);
    if ((iVar1 < 1) || (0x17 < iVar1)) {
      snprintf((char *)size_local,clock,"<can\'t produce local time format>");
    }
    else {
      sVar2 = strftime((char *)size_local,clock,local_58,__tp);
      if (sVar2 == 0) {
        snprintf((char *)size_local,clock,"<can\'t format local time>");
      }
    }
  }
  return;
}

Assistant:

static void time_format(char *buf, size_t size, struct timespec ts) {
    time_t clock = ts.tv_sec;
    struct tm* tm = localtime(&clock);
    if (tm == 0) {
      snprintf(buf, size, "<can't find local time>");
      return;
    }

    char time_format[24];
    int ret = snprintf(time_format, sizeof(time_format), "%%F %%T.%09ld", ts.tv_nsec);
    if (ret <= 0 || ret >= (int)sizeof(time_format)) {
      snprintf(buf, size, "<can't produce local time format>");
      return;
    }

    if (strftime(buf, size, time_format, tm) == 0) {
      snprintf(buf, size, "<can't format local time>");
      return;
    }
}